

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

size_type __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Seed
          (InnerMap *this)

{
  uint uVar1;
  result_type rVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  uniform_int_distribution<unsigned_long> u;
  knuth_b knuth;
  random_device rd;
  param_type local_1bb8;
  shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
  local_1ba8;
  random_device local_1398;
  
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  uVar3 = uVar1 / 0x7fffffff << 0x1f | uVar1 / 0x7fffffff;
  uVar4 = (ulong)(uVar3 + uVar1 + (uint)(uVar1 + uVar3 == 0));
  lVar5 = 1;
  do {
    uVar4 = (uVar4 * 0x41a7) % 0x7fffffff;
    local_1ba8._M_v[lVar5 + -1] = uVar4;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x101);
  local_1ba8._M_b._M_x = (uVar4 * 0x41a7) % 0x7fffffff;
  local_1bb8._M_a = 0;
  local_1bb8._M_b = 0xffffffffffffffff;
  local_1ba8._M_y = local_1ba8._M_b._M_x;
  rVar2 = std::uniform_int_distribution<unsigned_long>::operator()
                    ((uniform_int_distribution<unsigned_long> *)&local_1bb8,&local_1ba8,&local_1bb8)
  ;
  std::random_device::_M_fini();
  return rVar2;
}

Assistant:

size_type Seed() const {
      // random_device can throw, so avoid it unless we are compiling with
      // exceptions enabled.
#if __cpp_exceptions && LANG_CXX11
      try {
        std::random_device rd;
        std::knuth_b knuth(rd());
        std::uniform_int_distribution<size_type> u;
        return u(knuth);
      } catch (...) { }
#endif
      size_type s = static_cast<size_type>(reinterpret_cast<uintptr_t>(this));
#if defined(__x86_64__) && defined(__GNUC__)
      uint32 hi, lo;
      asm("rdtsc" : "=a" (lo), "=d" (hi));
      s += ((static_cast<uint64>(hi) << 32) | lo);
#endif
      return s;
    }